

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O0

double nrminf(cupdlp_int n,double *x,cupdlp_int incx)

{
  double tmp;
  int i;
  double nrm;
  cupdlp_int incx_local;
  double *x_local;
  cupdlp_int n_local;
  
  nrm = 0.0;
  for (i = 0; i < n; i = i + 1) {
    if (nrm < ABS(x[i])) {
      nrm = ABS(x[i]);
    }
  }
  return nrm;
}

Assistant:

double nrminf(cupdlp_int n, const double *x, cupdlp_int incx) {
#ifdef USE_MY_BLAS
  assert(incx == 1);

  double nrm = 0.0;

  for (int i = 0; i < n; ++i) {
    double tmp = fabs(x[i]);
    if (tmp > nrm) nrm = tmp;
  }

  return nrm;
#else
  return dnrm2(n, x, incx);
#endif
}